

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O2

InplaceStr GetArgumentSetTypeName(ExpressionContext *ctx,IntrusiveList<TypeHandle> types)

{
  char *__src;
  TypeBase **ppTVar1;
  int iVar2;
  TypeHandle *pTVar3;
  undefined4 extraout_var;
  size_t sVar4;
  uint uVar5;
  TypeHandle *pTVar6;
  int iVar7;
  char *__dest;
  InplaceStr IVar8;
  
  pTVar6 = types.tail;
  iVar7 = 2;
  pTVar3 = types.head;
  while (pTVar3 != (TypeHandle *)0x0) {
    ppTVar1 = &pTVar3->type;
    pTVar3 = pTVar3->next;
    uVar5 = *(int *)&((*ppTVar1)->name).end - *(int *)&((*ppTVar1)->name).begin;
    pTVar6 = (TypeHandle *)(ulong)uVar5;
    iVar7 = ((iVar7 + 1) - (uint)(pTVar3 == (TypeHandle *)0x0)) + uVar5;
  }
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(iVar7 + 1U),pTVar6);
  IVar8.begin = (char *)CONCAT44(extraout_var,iVar2);
  __dest = IVar8.begin + 1;
  *IVar8.begin = '(';
  pTVar3 = types.head;
  while (pTVar6 = pTVar3, pTVar6 != (TypeHandle *)0x0) {
    __src = (pTVar6->type->name).begin;
    memcpy(__dest,__src,(ulong)(uint)(*(int *)&(pTVar6->type->name).end - (int)__src));
    __dest = __dest + (uint)(*(int *)&(pTVar6->type->name).end - *(int *)&(pTVar6->type->name).begin
                            );
    pTVar3 = (TypeHandle *)0x0;
    if (pTVar6->next != (TypeHandle *)0x0) {
      *__dest = ',';
      __dest = __dest + 1;
      pTVar3 = pTVar6->next;
    }
  }
  __dest[0] = ')';
  __dest[1] = '\0';
  sVar4 = strlen(IVar8.begin);
  if (sVar4 + 1 == (ulong)(iVar7 + 1U)) {
    IVar8.end = IVar8.begin + sVar4;
    return IVar8;
  }
  __assert_fail("strlen(name) + 1 == nameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0x148,
                "InplaceStr GetArgumentSetTypeName(ExpressionContext &, IntrusiveList<TypeHandle>)")
  ;
}

Assistant:

InplaceStr GetArgumentSetTypeName(ExpressionContext &ctx, IntrusiveList<TypeHandle> types)
{
	unsigned nameLength = 2;

	for(TypeHandle *arg = types.head; arg; arg = arg->next)
		nameLength += arg->type->name.length() + (arg->next ? 1 : 0);

	nameLength += 1;

	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	*pos++ = '(';

	for(TypeHandle *arg = types.head; arg; arg = arg->next)
	{
		memcpy(pos, arg->type->name.begin, arg->type->name.length());
		pos += arg->type->name.length();

		if(arg->next)
			*pos++ = ',';
	}

	*pos++ = ')';
	*pos++ = 0;

	assert(strlen(name) + 1 == nameLength);
	return InplaceStr(name);
}